

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O0

cx_string<33UL> *
mserialize::cx_strcat<1ul,1ul,12ul,1ul,6ul,1ul,10ul,1ul>
          (cx_string<1UL> *strings,cx_string<1UL> *strings_1,cx_string<12UL> *strings_2,
          cx_string<1UL> *strings_3,cx_string<6UL> *strings_4,cx_string<1UL> *strings_5,
          cx_string<10UL> *strings_6,cx_string<1UL> *strings_7)

{
  cx_string<12UL> *in_RCX;
  cx_string<1UL> *in_RDX;
  cx_string<1UL> *in_RSI;
  cx_string<33UL> *in_RDI;
  cx_string<1UL> *in_R8;
  cx_string<6UL> *in_R9;
  cx_string<1UL> *in_stack_00000008;
  cx_string<10UL> *in_stack_00000010;
  size_t s;
  size_t i;
  char *out;
  size_t size [9];
  char *data [9];
  char buffer [34];
  char *in_stack_fffffffffffffef0;
  ulong local_108;
  char *local_100;
  size_t local_f0 [9];
  char *local_a8;
  data_ref local_a0 [2];
  data_ref local_90;
  data_ref local_88;
  data_ref local_80;
  data_ref local_78;
  data_ref local_70;
  data_ref local_68;
  char local_58 [48];
  cx_string<6UL> *local_28;
  cx_string<1UL> *local_20;
  cx_string<12UL> *local_18;
  cx_string<1UL> *local_10;
  cx_string<1UL> *local_8;
  
  local_28 = in_R9;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_RDX;
  local_8 = in_RSI;
  memset(local_58,0,0x22);
  local_a8 = "";
  local_a0[0] = cx_string<1UL>::data(local_8);
  local_a0[1] = cx_string<1UL>::data(local_10);
  local_90 = cx_string<12UL>::data(local_18);
  local_88 = cx_string<1UL>::data(local_20);
  local_80 = cx_string<6UL>::data(local_28);
  local_78 = cx_string<1UL>::data(in_stack_00000008);
  local_70 = cx_string<10UL>::data(in_stack_00000010);
  local_68 = cx_string<1UL>::data((cx_string<1UL> *)s);
  local_f0[0] = cx_string<1UL>::size(local_8);
  local_f0[1] = cx_string<1UL>::size(local_10);
  local_f0[2] = cx_string<12UL>::size(local_18);
  local_f0[3] = cx_string<1UL>::size(local_20);
  local_f0[4] = cx_string<6UL>::size(local_28);
  local_f0[5] = cx_string<1UL>::size(in_stack_00000008);
  local_f0[6] = cx_string<10UL>::size(in_stack_00000010);
  local_f0[7] = cx_string<1UL>::size((cx_string<1UL> *)s);
  local_100 = local_58;
  for (local_108 = 1; local_108 < 9; local_108 = local_108 + 1) {
    for (in_stack_fffffffffffffef0 = (char *)0x0;
        in_stack_fffffffffffffef0 < (cx_string<33UL> *)local_f0[local_108 - 1];
        in_stack_fffffffffffffef0 = in_stack_fffffffffffffef0 + 1) {
      *local_100 = in_stack_fffffffffffffef0[(long)local_a0[local_108 - 1]];
      local_100 = local_100 + 1;
    }
  }
  cx_string<33UL>::cx_string((cx_string<33UL> *)in_stack_fffffffffffffef0,in_RDI->_data);
  return in_RDI;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}